

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::ExpectationBase
          (ExpectationBase *this,char *a_file,int a_line,string *a_source_text)

{
  string *a_source_text_local;
  int a_line_local;
  char *a_file_local;
  ExpectationBase *this_local;
  
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_001d9178;
  this->file_ = a_file;
  this->line_ = a_line;
  std::__cxx11::string::string((string *)&this->source_text_,(string *)a_source_text);
  this->cardinality_specified_ = false;
  Exactly((testing *)&this->cardinality_,1);
  ExpectationSet::ExpectationSet(&this->immediate_prerequisites_);
  this->call_count_ = 0;
  this->retired_ = false;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::vector(&this->untyped_actions_);
  this->extra_matcher_specified_ = false;
  this->repeated_action_specified_ = false;
  this->retires_on_saturation_ = false;
  this->last_clause_ = kNone;
  this->action_count_checked_ = false;
  Mutex::Mutex(&this->mutex_);
  return;
}

Assistant:

ExpectationBase::ExpectationBase(const char* a_file,
                                 int a_line,
                                 const string& a_source_text)
    : file_(a_file),
      line_(a_line),
      source_text_(a_source_text),
      cardinality_specified_(false),
      cardinality_(Exactly(1)),
      call_count_(0),
      retired_(false),
      extra_matcher_specified_(false),
      repeated_action_specified_(false),
      retires_on_saturation_(false),
      last_clause_(kNone),
      action_count_checked_(false) {}